

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O3

void generateAsm<true>(uint32_t nonce)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  AssemblyGeneratorX86 asmX86;
  uint64_t hash [8];
  uint8_t blockTemplate [76];
  Program p;
  uint8_t scratchpad [2097152];
  
  puVar2 = blockTemplate_;
  puVar3 = (undefined8 *)&stack0xffffffffffdff728;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + 8;
    puVar3 = puVar3 + 1;
  }
  randomx_blake2b(&stack0xffffffffffdff6e8,0x40,&stack0xffffffffffdff728,0x4c,(void *)0x0,0);
  fillAes1Rx4<true>(&stack0xffffffffffdff6e8,0x200000,&stack0xffffffffffdffff8);
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xffffffffffdff540);
  fillAes4Rx4<true>(&stack0xffffffffffdff6e8,0x880,&stack0xffffffffffdff778);
  randomx::AssemblyGeneratorX86::generateProgram
            ((AssemblyGeneratorX86 *)&stack0xffffffffffdff540,(Program *)&stack0xffffffffffdff778);
  std::ostream::operator<<(&std::cout,(streambuf *)&stack0xffffffffffdff558);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xffffffffffdff540);
  std::ios_base::~ios_base((ios_base *)&stack0xffffffffffdff5c0);
  return;
}

Assistant:

void generateAsm(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[randomx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, randomx::ScratchpadSize, scratchpad);
	randomx::AssemblyGeneratorX86 asmX86;
	randomx::Program p;
	fillAes4Rx4<softAes>(hash, sizeof(p), &p);
	asmX86.generateProgram(p);
	asmX86.printCode(std::cout);
}